

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O0

QString * QDnsLookupRunnable::decodeLabel<QLatin1String>(QLatin1String encodedLabel)

{
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  QLatin1String *pQVar1;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = in_RDI;
  QLatin1String::toString(in_RDI);
  QFlags<QUrl::AceProcessingOption>::QFlags((QFlags<QUrl::AceProcessingOption> *)0x366227);
  qt_ACE_do((QString *)pQVar1,(AceOperation)local_30,ForbidLeadingDot,(QFlags_conflict *)0x1);
  QString::~QString((QString *)0x36624c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString decodeLabel(T encodedLabel)
    {
        return qt_ACE_do(encodedLabel.toString(), NormalizeAce, ForbidLeadingDot);
    }